

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O2

void __thiscall
script_standard_tests::script_standard_Solver_success::test_method
          (script_standard_Solver_success *this)

{
  long lVar1;
  undefined8 data;
  pointer pvVar2;
  bool bVar3;
  readonly_property<bool> rVar4;
  TxoutType TVar5;
  long lVar6;
  CScript *pCVar7;
  CSHA256 *this_00;
  uint uVar8;
  CKey *this_01;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  uint256 *puVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar13;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  const_string file_00;
  const_string file_01;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<unsigned_char> __l;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  initializer_list<unsigned_char> __l_00;
  span<const_std::byte,_18446744073709551615UL> b_04;
  span<const_std::byte,_18446744073709551615UL> b_05;
  span<const_std::byte,_18446744073709551615UL> b_06;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  initializer_list<unsigned_char> __l_01;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  span<const_std::byte,_18446744073709551615UL> b_07;
  initializer_list<unsigned_char> __l_04;
  span<const_std::byte,_18446744073709551615UL> b_08;
  initializer_list<unsigned_char> __l_05;
  span<const_std::byte,_18446744073709551615UL> b_09;
  const_string file_21;
  const_string file_22;
  span<const_std::byte,_18446744073709551615UL> b_10;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  span<const_std::byte,_18446744073709551615UL> b_11;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  span<const_std::byte,_18446744073709551615UL> b_12;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  span<const_std::byte,_18446744073709551615UL> b_13;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  initializer_list<unsigned_char> __l_06;
  const_string file_35;
  initializer_list<unsigned_char> __l_07;
  span<const_std::byte,_18446744073709551615UL> b_14;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *p_Var14;
  allocator_type *paVar15;
  char *local_aa8;
  char *local_aa0;
  undefined1 *local_a98;
  undefined1 *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  int version;
  char *local_9e0;
  char *local_9d8;
  undefined1 *local_9d0;
  undefined1 *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  undefined1 *local_9a0;
  undefined1 *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  allocator_type local_6a9;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solutions;
  char *local_268;
  char *local_260;
  assertion_result local_258;
  uchar local_239;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_program;
  undefined1 local_220 [8];
  bool local_218;
  undefined7 uStack_217;
  undefined1 *local_210;
  allocator_type *local_208;
  uint256 scriptHash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> anchor_bytes;
  CScript redeemScript;
  CScript s;
  CPubKey pubkeys [3];
  undefined1 auStack_70 [8];
  CKey keys [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 8;
  do {
    auStack_70[lVar6] = 0;
    *(undefined8 *)(&keys[0].fCompressed + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x38);
  pubkeys[0].vch[0] = 0xff;
  pubkeys[1].vch[0] = 0xff;
  pubkeys[2].vch[0] = 0xff;
  this_01 = keys;
  lVar6 = 0;
  while( true ) {
    if (lVar6 == 0xc3) break;
    CKey::MakeNewKey(this_01,true);
    CKey::GetPubKey((CPubKey *)local_220,this_01);
    memcpy(pubkeys[0].vch + lVar6,(CPubKey *)local_220,0x41);
    lVar6 = lVar6 + 0x41;
    this_01 = this_01 + 1;
  }
  s.super_CScriptBase._union._16_8_ = 0;
  s.super_CScriptBase._24_8_ = 0;
  s.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  s.super_CScriptBase._union._8_8_ = 0;
  solutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  solutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  solutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CScript::clear(&s);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,pubkeys);
  b._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b._M_ptr = (pointer)local_220;
  pCVar7 = CScript::operator<<(&s,b);
  CScript::operator<<(pCVar7,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x2c;
  file.m_begin = (iterator)&local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a8,msg);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2b0 = "";
  redeemScript.super_CScriptBase._union._0_4_ = Solver(&s,&solutions);
  pCVar7 = &redeemScript;
  puVar11 = &scriptHash;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = '\x02';
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_2b8,0x2c,1,2,pCVar7,"Solver(s, solutions)",puVar11,"TxoutType::PUBKEY"
            );
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pCVar7;
  msg_00.m_begin = pvVar9;
  file_00.m_end = (iterator)0x2d;
  file_00.m_begin = (iterator)&local_2c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d8,
             msg_00);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2e0 = "";
  redeemScript.super_CScriptBase._union.indirect_contents.indirect =
       (char *)(((long)solutions.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pCVar7 = &redeemScript;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_2e8,0x2d,1,2,pCVar7,"solutions.size()",puVar11,"1U");
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pCVar7;
  msg_01.m_begin = pvVar9;
  file_01.m_end = (iterator)0x2e;
  file_01.m_begin = (iterator)&local_2f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_308,
             msg_01);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys);
  bVar3 = std::operator==(pvVar2,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &scriptHash);
  redeemScript.super_CScriptBase._union.direct[0] = bVar3;
  redeemScript.super_CScriptBase._union._8_8_ = 0;
  redeemScript.super_CScriptBase._union._16_8_ = 0;
  local_208 = (allocator_type *)&anchor_bytes;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[0] == ToByteVector(pubkeys[0])";
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_310 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&redeemScript,(lazy_ostream *)local_220,1,0,WARN,
             (check_type)puVar11,(size_t)&local_318,0x2e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&redeemScript.super_CScriptBase._union + 0x10));
  puVar11 = &scriptHash;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)puVar11);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_DUP);
  pCVar7 = CScript::operator<<(pCVar7,OP_HASH160);
  CPubKey::GetID((CKeyID *)&redeemScript,pubkeys);
  ToByteVector<CKeyID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,
             (CKeyID *)&redeemScript);
  b_00._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_00._M_ptr = (pointer)local_220;
  pCVar7 = CScript::operator<<(pCVar7,b_00);
  pCVar7 = CScript::operator<<(pCVar7,OP_EQUALVERIFY);
  CScript::operator<<(pCVar7,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  file_02.m_end = (iterator)0x33;
  file_02.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_338,
             msg_02);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_340 = "";
  TVar5 = Solver(&s,&solutions);
  pCVar7 = &redeemScript;
  redeemScript.super_CScriptBase._union._0_4_ = TVar5;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = '\x03';
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_348,0x33,1,2,pCVar7,"Solver(s, solutions)",puVar11,
             "TxoutType::PUBKEYHASH");
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pCVar7;
  msg_03.m_begin = pvVar9;
  file_03.m_end = (iterator)0x34;
  file_03.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_368,
             msg_03);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_370 = "";
  redeemScript.super_CScriptBase._union.indirect_contents.indirect =
       (char *)(((long)solutions.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pCVar7 = &redeemScript;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_378,0x34,1,2,pCVar7,"solutions.size()",puVar11,"1U");
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pCVar7;
  msg_04.m_begin = pvVar9;
  file_04.m_end = (iterator)0x35;
  file_04.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_398,
             msg_04);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CPubKey::GetID((CKeyID *)&anchor_bytes,pubkeys);
  pvVar13 = &anchor_bytes;
  ToByteVector<CKeyID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,(CKeyID *)pvVar13)
  ;
  bVar3 = std::operator==(pvVar2,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &scriptHash);
  redeemScript.super_CScriptBase._union.direct[0] = bVar3;
  redeemScript.super_CScriptBase._union._8_8_ = 0;
  redeemScript.super_CScriptBase._union._16_8_ = 0;
  local_208 = (allocator_type *)&witness_program;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[0] == ToByteVector(pubkeys[0].GetID())";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3a0 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&redeemScript,(lazy_ostream *)local_220,1,0,WARN,
             (check_type)puVar11,(size_t)&local_3a8,0x35);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&redeemScript.super_CScriptBase._union + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&redeemScript.super_CScriptBase,&s.super_CScriptBase);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_HASH160);
  CScriptID::CScriptID((CScriptID *)&scriptHash,&redeemScript);
  ToByteVector<CScriptID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,
             (CScriptID *)&scriptHash);
  b_01._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_01._M_ptr = (pointer)local_220;
  pCVar7 = CScript::operator<<(pCVar7,b_01);
  CScript::operator<<(pCVar7,OP_EQUAL);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  file_05.m_end = (iterator)0x3b;
  file_05.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3c8,
             msg_05);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3d0 = "";
  TVar5 = Solver(&s,&solutions);
  puVar11 = &scriptHash;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = (char)TVar5;
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = (char)(TVar5 >> 8);
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = (char)(TVar5 >> 0x10);
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = (char)(TVar5 >> 0x18);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,4);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_3d8,0x3b,1,2,puVar11,"Solver(s, solutions)",pvVar13,
             "TxoutType::SCRIPTHASH");
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)puVar11;
  msg_06.m_begin = pvVar9;
  file_06.m_end = (iterator)0x3c;
  file_06.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3f8,
             msg_06);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_400 = "";
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)solutions.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  puVar11 = &scriptHash;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_408,0x3c,1,2,puVar11,"solutions.size()",pvVar13,"1U");
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)puVar11;
  msg_07.m_begin = pvVar9;
  file_07.m_end = (iterator)0x3d;
  file_07.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_428,
             msg_07);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CScriptID::CScriptID((CScriptID *)&witness_program,&redeemScript);
  ToByteVector<CScriptID>(&anchor_bytes,(CScriptID *)&witness_program);
  bVar3 = std::operator==(pvVar2,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = bVar3;
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_208 = (allocator_type *)&local_258;
  local_258._0_8_ = "solutions[0] == ToByteVector(CScriptID(redeemScript))";
  local_258.m_message.px = (element_type *)0xbc3116;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_430 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)pvVar13,
             (size_t)&local_438,0x3d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  p_Var14 = &anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(p_Var14);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_1);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,pubkeys);
  b_02._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_02._M_ptr = (pointer)local_220;
  pCVar7 = CScript::operator<<(pCVar7,b_02);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys + 1);
  b_03._M_extent._M_extent_value =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
       scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  b_03._M_ptr = (pointer)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  pCVar7 = CScript::operator<<(pCVar7,b_03);
  pCVar7 = CScript::operator<<(pCVar7,OP_2);
  CScript::operator<<(pCVar7,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  file_08.m_end = (iterator)0x45;
  file_08.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_458,
             msg_08);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_460 = "";
  TVar5 = Solver(&s,&solutions);
  puVar11 = &scriptHash;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = (char)TVar5;
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = (char)(TVar5 >> 8);
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = (char)(TVar5 >> 0x10);
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = (char)(TVar5 >> 0x18);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,5);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_468,0x45,1,2,puVar11,"Solver(s, solutions)",p_Var14,
             "TxoutType::MULTISIG");
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)puVar11;
  msg_09.m_begin = pvVar9;
  file_09.m_end = (iterator)0x46;
  file_09.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_488,
             msg_09);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_490 = "";
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)solutions.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  puVar11 = &scriptHash;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,4);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_498,0x46,1,2,puVar11,"solutions.size()",p_Var14,"4U");
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)puVar11;
  msg_10.m_begin = pvVar9;
  file_10.m_end = (iterator)0x47;
  file_10.m_begin = (iterator)&local_4a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4b8,
             msg_10);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&anchor_bytes,__l,(allocator_type *)&local_268);
  bVar3 = std::operator==(pvVar2,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[0] == std::vector<unsigned char>({1})";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_4c0 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&witness_program;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = bVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_4c8,0x47);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar10;
  msg_11.m_begin = pvVar9;
  file_11.m_end = (iterator)0x48;
  file_11.m_begin = (iterator)&local_4d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4e8,
             msg_11);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ToByteVector<CPubKey>(&anchor_bytes,pubkeys);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = std::operator==(pvVar2 + 1,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[1] == ToByteVector(pubkeys[0])";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_4f0 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&witness_program;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_4f8,0x48);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar10;
  msg_12.m_begin = pvVar9;
  file_12.m_end = (iterator)0x49;
  file_12.m_begin = (iterator)&local_508;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_518,
             msg_12);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ToByteVector<CPubKey>(&anchor_bytes,pubkeys + 1);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = std::operator==(pvVar2 + 2,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[2] == ToByteVector(pubkeys[1])";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_520 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&witness_program;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_528,0x49);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar10;
  msg_13.m_begin = pvVar9;
  file_13.m_end = (iterator)0x4a;
  file_13.m_begin = (iterator)&local_538;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_548,
             msg_13);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x2;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&anchor_bytes,__l_00,(allocator_type *)&local_268);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = std::operator==(pvVar2 + 3,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[3] == std::vector<unsigned char>({2})";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_550 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&witness_program;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_558,0x4a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_2);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,pubkeys);
  b_04._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_04._M_ptr = (pointer)local_220;
  pCVar7 = CScript::operator<<(pCVar7,b_04);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys + 1);
  b_05._M_extent._M_extent_value =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
       scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  b_05._M_ptr = (pointer)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  pCVar7 = CScript::operator<<(pCVar7,b_05);
  ToByteVector<CPubKey>(&anchor_bytes,pubkeys + 2);
  b_06._M_extent._M_extent_value =
       (long)anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_06._M_ptr = anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pCVar7 = CScript::operator<<(pCVar7,b_06);
  pCVar7 = CScript::operator<<(pCVar7,OP_3);
  CScript::operator<<(pCVar7,OP_CHECKMULTISIG);
  p_Var14 = &anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(p_Var14);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar10;
  msg_14.m_begin = pvVar9;
  file_14.m_end = (iterator)0x52;
  file_14.m_begin = (iterator)&local_568;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_578,
             msg_14);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_580 = "";
  TVar5 = Solver(&s,&solutions);
  puVar11 = &scriptHash;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = (char)TVar5;
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = (char)(TVar5 >> 8);
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = (char)(TVar5 >> 0x10);
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = (char)(TVar5 >> 0x18);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,5);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_588,0x52,1,2,puVar11,"Solver(s, solutions)",p_Var14,
             "TxoutType::MULTISIG");
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = (iterator)puVar11;
  msg_15.m_begin = pvVar9;
  file_15.m_end = (iterator)0x53;
  file_15.m_begin = (iterator)&local_598;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_5a8,
             msg_15);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_5b0 = "";
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)solutions.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  puVar11 = &scriptHash;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,5);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_5b8,0x53,1,2,puVar11,"solutions.size()",p_Var14,"5U");
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = (iterator)puVar11;
  msg_16.m_begin = pvVar9;
  file_16.m_end = (iterator)0x54;
  file_16.m_begin = (iterator)&local_5c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_5d8,
             msg_16);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x2;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&anchor_bytes,__l_01,(allocator_type *)&local_268);
  bVar3 = std::operator==(pvVar2,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[0] == std::vector<unsigned char>({2})";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_5e0 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&witness_program;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = bVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_5e8,0x54);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar10;
  msg_17.m_begin = pvVar9;
  file_17.m_end = (iterator)0x55;
  file_17.m_begin = (iterator)&local_5f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_608,
             msg_17);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ToByteVector<CPubKey>(&anchor_bytes,pubkeys);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = std::operator==(pvVar2 + 1,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[1] == ToByteVector(pubkeys[0])";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_610 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&witness_program;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_618,0x55);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar10;
  msg_18.m_begin = pvVar9;
  file_18.m_end = (iterator)0x56;
  file_18.m_begin = (iterator)&local_628;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_638,
             msg_18);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ToByteVector<CPubKey>(&anchor_bytes,pubkeys + 1);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = std::operator==(pvVar2 + 2,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[2] == ToByteVector(pubkeys[1])";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_640 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&witness_program;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_648,0x56);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar10;
  msg_19.m_begin = pvVar9;
  file_19.m_end = (iterator)0x57;
  file_19.m_begin = (iterator)&local_658;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_668,
             msg_19);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ToByteVector<CPubKey>(&anchor_bytes,pubkeys + 2);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = std::operator==(pvVar2 + 3,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[3] == ToByteVector(pubkeys[2])";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_670 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&witness_program;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_678,0x57);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar10;
  msg_20.m_begin = pvVar9;
  file_20.m_end = &DAT_00000058;
  file_20.m_begin = (iterator)&local_688;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_698,
             msg_20);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x3;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&anchor_bytes,__l_02,(allocator_type *)&local_268);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = std::operator==(pvVar2 + 4,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "solutions[4] == std::vector<unsigned char>({3})";
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_6a0 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&witness_program;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_6a8,0x58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_RETURN);
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)witness_program.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&witness_program;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,__l_03,
             (allocator_type *)&local_258);
  b_07._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_07._M_ptr = (pointer)local_220;
  pCVar7 = CScript::operator<<(pCVar7,b_07);
  local_268._0_1_ = (allocator_type)0x4b;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_268;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,__l_04,
             (allocator_type *)&version);
  b_08._M_extent._M_extent_value =
       scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ -
       scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  b_08._M_ptr = (pointer)scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_;
  pCVar7 = CScript::operator<<(pCVar7,b_08);
  local_239 = 0xff;
  __l_05._M_len = 1;
  __l_05._M_array = &local_239;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&anchor_bytes,__l_05,&local_6a9);
  b_09._M_extent._M_extent_value =
       (long)anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_09._M_ptr = anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  CScript::operator<<(pCVar7,b_09);
  p_Var14 = &anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(p_Var14);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar10;
  msg_21.m_begin = pvVar9;
  file_21.m_end = (iterator)0x60;
  file_21.m_begin = (iterator)&local_6c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_6d0,
             msg_21);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_6d8 = "";
  TVar5 = Solver(&s,&solutions);
  puVar11 = &scriptHash;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = (char)TVar5;
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = (char)(TVar5 >> 8);
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = (char)(TVar5 >> 0x10);
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = (char)(TVar5 >> 0x18);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,6);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_6e0,0x60,1,2,puVar11,"Solver(s, solutions)",p_Var14,
             "TxoutType::NULL_DATA");
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = (iterator)puVar11;
  msg_22.m_begin = pvVar9;
  file_22.m_end = (iterator)0x61;
  file_22.m_begin = (iterator)&local_6f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_700,
             msg_22);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_708 = "";
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)solutions.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  puVar11 = &scriptHash;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)anchor_bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_710,0x61,1,2,puVar11,"solutions.size()",p_Var14,"0U");
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_0);
  CPubKey::GetID((CKeyID *)&scriptHash,pubkeys);
  ToByteVector<CKeyID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,
             (CKeyID *)&scriptHash);
  b_10._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_10._M_ptr = (pointer)local_220;
  CScript::operator<<(pCVar7,b_10);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = (iterator)puVar11;
  msg_23.m_begin = pvVar9;
  file_23.m_end = (iterator)0x66;
  file_23.m_begin = (iterator)&local_720;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_730,
             msg_23);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_738 = "";
  TVar5 = Solver(&s,&solutions);
  puVar11 = &scriptHash;
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = (char)TVar5;
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = (char)(TVar5 >> 8);
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = (char)(TVar5 >> 0x10);
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = (char)(TVar5 >> 0x18);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,8);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_740,0x66,1,2,puVar11,"Solver(s, solutions)",p_Var14,
             "TxoutType::WITNESS_V0_KEYHASH");
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = (iterator)puVar11;
  msg_24.m_begin = pvVar9;
  file_24.m_end = (iterator)0x67;
  file_24.m_begin = (iterator)&local_750;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_760,
             msg_24);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_768 = "";
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ((long)solutions.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)solutions.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  puVar11 = &scriptHash;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_770,0x67,1,2,puVar11,"solutions.size()",p_Var14,"1U");
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = (iterator)puVar11;
  msg_25.m_begin = pvVar9;
  file_25.m_end = &DAT_00000068;
  file_25.m_begin = (iterator)&local_780;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_790,
             msg_25);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CPubKey::GetID((CKeyID *)&witness_program,pubkeys);
  pvVar13 = &witness_program;
  ToByteVector<CKeyID>(&anchor_bytes,(CKeyID *)pvVar13);
  bVar3 = std::operator==(pvVar2,&anchor_bytes);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = bVar3;
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_258._0_8_ = "solutions[0] == ToByteVector(pubkeys[0].GetID())";
  local_258.m_message.px = (element_type *)0xbc30ca;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_798 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptHash,(lazy_ostream *)local_220,1,0,WARN,(check_type)p_Var14,
             (size_t)&local_7a0,0x68);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(scriptHash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::CSHA256((CSHA256 *)local_220);
  uVar8 = redeemScript.super_CScriptBase._size - 0x1d;
  data = redeemScript.super_CScriptBase._union.indirect_contents.indirect;
  if (redeemScript.super_CScriptBase._size < 0x1d) {
    uVar8 = redeemScript.super_CScriptBase._size;
    data = &redeemScript;
  }
  this_00 = CSHA256::Write((CSHA256 *)local_220,(uchar *)data,(ulong)uVar8);
  CSHA256::Finalize(this_00,(uchar *)&scriptHash);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_0);
  ToByteVector<uint256>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,&scriptHash);
  b_11._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_11._M_ptr = (pointer)local_220;
  CScript::operator<<(pCVar7,b_11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = pvVar10;
  msg_26.m_begin = pvVar9;
  file_26.m_end = (iterator)0x71;
  file_26.m_begin = (iterator)&local_7b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_7c0,
             msg_26);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_7c8 = "";
  TVar5 = Solver(&s,&solutions);
  pvVar12 = &anchor_bytes;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,TVar5);
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,7);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_7d0,0x71,1,2,pvVar12,"Solver(s, solutions)",pvVar13,
             "TxoutType::WITNESS_V0_SCRIPTHASH");
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = (iterator)pvVar12;
  msg_27.m_begin = pvVar9;
  file_27.m_end = (iterator)0x72;
  file_27.m_begin = (iterator)&local_7e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_7f0,
             msg_27);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_7f8 = "";
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)solutions.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)solutions.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pvVar12 = &anchor_bytes;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_800,0x72,1,2,pvVar12,"solutions.size()",pvVar13,"1U");
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = (iterator)pvVar12;
  msg_28.m_begin = pvVar9;
  file_28.m_end = (iterator)0x73;
  file_28.m_begin = (iterator)&local_810;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_820,
             msg_28);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ToByteVector<uint256>(&witness_program,&scriptHash);
  bVar3 = std::operator==(pvVar2,&witness_program);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar3);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._0_8_ = "solutions[0] == ToByteVector(scriptHash)";
  local_258.m_message.px = (element_type *)0xbc32ce;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_828 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&anchor_bytes,(lazy_ostream *)local_220,1,0,WARN,
             (check_type)pvVar13,(size_t)&local_830,0x73);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  p_Var14 = &witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(p_Var14);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_1);
  ToByteVector<uint256>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,&uint256::ZERO);
  b_12._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_12._M_ptr = (pointer)local_220;
  CScript::operator<<(pCVar7,b_12);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = pvVar10;
  msg_29.m_begin = pvVar9;
  file_29.m_end = (iterator)0x78;
  file_29.m_begin = (iterator)&local_840;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_850,
             msg_29);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_858 = "";
  TVar5 = Solver(&s,&solutions);
  pvVar13 = &anchor_bytes;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,TVar5);
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,9);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_860,0x78,1,2,pvVar13,"Solver(s, solutions)",p_Var14,
             "TxoutType::WITNESS_V1_TAPROOT");
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_868 = "";
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = (iterator)pvVar13;
  msg_30.m_begin = pvVar9;
  file_30.m_end = (iterator)0x79;
  file_30.m_begin = (iterator)&local_870;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_880,
             msg_30);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_888 = "";
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)solutions.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)solutions.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pvVar13 = &anchor_bytes;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_890,0x79,1,2,pvVar13,"solutions.size()",p_Var14,"1U");
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = (iterator)pvVar13;
  msg_31.m_begin = pvVar9;
  file_31.m_end = (iterator)0x7a;
  file_31.m_begin = (iterator)&local_8a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_8b0,
             msg_31);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ToByteVector<uint256>(&witness_program,&uint256::ZERO);
  bVar3 = std::operator==(pvVar2,&witness_program);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar3);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._0_8_ = "solutions[0] == ToByteVector(uint256::ZERO)";
  local_258.m_message.px = (element_type *)0xbc3318;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_8c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_8b8 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&anchor_bytes,(lazy_ostream *)local_220,1,0,WARN,
             (check_type)p_Var14,(size_t)&local_8c0,0x7a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  p_Var14 = &witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(p_Var14);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_16);
  ToByteVector<uint256>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,&uint256::ONE);
  b_13._M_extent._M_extent_value = CONCAT71(uStack_217,local_218) - (long)local_220;
  b_13._M_ptr = (pointer)local_220;
  CScript::operator<<(pCVar7,b_13);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_8c8 = "";
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar10;
  msg_32.m_begin = pvVar9;
  file_32.m_end = (iterator)0x7f;
  file_32.m_begin = (iterator)&local_8d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_8e0,
             msg_32);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_8f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_8e8 = "";
  TVar5 = Solver(&s,&solutions);
  pvVar13 = &anchor_bytes;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,TVar5);
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,10);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_8f0,0x7f,1,2,pvVar13,"Solver(s, solutions)",p_Var14,
             "TxoutType::WITNESS_UNKNOWN");
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_8f8 = "";
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = (iterator)pvVar13;
  msg_33.m_begin = pvVar9;
  file_33.m_end = (iterator)0x80;
  file_33.m_begin = (iterator)&local_900;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_910,
             msg_33);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_920 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_918 = "";
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)solutions.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)solutions.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pvVar13 = &anchor_bytes;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,2);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_220,&local_920,0x80,1,2,pvVar13,"solutions.size()",p_Var14,"2U");
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_928 = "";
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = (iterator)pvVar13;
  msg_34.m_begin = pvVar9;
  file_34.m_end = (iterator)0x81;
  file_34.m_begin = (iterator)&local_930;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_940,
             msg_34);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_268 = (char *)CONCAT71(local_268._1_7_,0x10);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_268;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&witness_program,__l_06,(allocator_type *)&version);
  bVar3 = std::operator==(pvVar2,&witness_program);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar3);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._0_8_ = "solutions[0] == std::vector<unsigned char>{16}";
  local_258.m_message.px = (element_type *)0xbc3362;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_950 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_948 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&anchor_bytes,(lazy_ostream *)local_220,1,0,WARN,
             (check_type)p_Var14,(size_t)&local_950,0x81);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_958 = "";
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = pvVar10;
  msg_35.m_begin = pvVar9;
  file_35.m_end = (iterator)0x82;
  file_35.m_begin = (iterator)&local_960;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_970,
             msg_35);
  pvVar2 = solutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ToByteVector<uint256>(&witness_program,&uint256::ONE);
  bVar3 = std::operator==(pvVar2 + 1,&witness_program);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(anchor_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar3);
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._0_8_ = "solutions[1] == ToByteVector(uint256::ONE)";
  local_258.m_message.px = (element_type *)0xbc338d;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_980 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_978 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&anchor_bytes,(lazy_ostream *)local_220,1,0,WARN,
             (check_type)p_Var14,(size_t)&local_980,0x82);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_220._0_2_ = 0x734e;
  __l_07._M_len = 2;
  __l_07._M_array = local_220;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&anchor_bytes,__l_07,(allocator_type *)&witness_program);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_1);
  b_14._M_extent._M_extent_value =
       (long)anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_14._M_ptr = anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  CScript::operator<<(pCVar7,b_14);
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_988 = "";
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_36.m_end = pvVar10;
  msg_36.m_begin = pvVar9;
  file_36.m_end = (iterator)0x88;
  file_36.m_begin = (iterator)&local_990;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_9a0,
             msg_36);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_9b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_9a8 = "";
  TVar5 = Solver(&s,&solutions);
  pvVar13 = &witness_program;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,TVar5);
  local_258._0_4_ = 1;
  pvVar9 = (iterator)0x2;
  paVar15 = (allocator_type *)&local_258;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_9b0,0x88,1,2,pvVar13,"Solver(s, solutions)",
             (allocator_type *)&local_258,"TxoutType::ANCHOR");
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_9b8 = "";
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_37.m_end = (iterator)pvVar13;
  msg_37.m_begin = pvVar9;
  file_37.m_end = (iterator)0x89;
  file_37.m_begin = (iterator)&local_9c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_9d0,
             msg_37);
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(witness_program.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         solutions.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         solutions.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._0_8_ = "solutions.empty()";
  local_258.m_message.px = (element_type *)0xbc33b1;
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_9e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_9d8 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&witness_program,(lazy_ostream *)local_220,1,0,WARN,
             (check_type)paVar15,(size_t)&local_9e0,0x89);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  version = -1;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_9f0 = "";
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_38.m_end = pvVar10;
  msg_38.m_begin = pvVar9;
  file_38.m_end = (iterator)0x8e;
  file_38.m_begin = (iterator)&local_9f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_a08,
             msg_38);
  rVar4.super_class_property<bool>.value = (class_property<bool>)CScript::IsPayToAnchor(&s);
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268 = "s.IsPayToAnchor()";
  local_260 = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_a18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_a10 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&local_268;
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)local_220,1,0,WARN,(check_type)paVar15,(size_t)&local_a18,
             0x8e);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_a28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_a20 = "";
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_39.m_end = pvVar10;
  msg_39.m_begin = pvVar9;
  file_39.m_end = (iterator)0x8f;
  file_39.m_begin = (iterator)&local_a28;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_a38,
             msg_39);
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsWitnessProgram(&s,&version,&witness_program);
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268 = "s.IsWitnessProgram(version, witness_program)";
  local_260 = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_a48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_a40 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)local_220,1,0,WARN,(check_type)paVar15,(size_t)&local_a48,
             0x8f);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_a50 = "";
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_40.m_end = pvVar10;
  msg_40.m_begin = pvVar9;
  file_40.m_end = (iterator)0x90;
  file_40.m_begin = (iterator)&local_a58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_a68,
             msg_40);
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsPayToAnchor(version,&witness_program);
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268 = "CScript::IsPayToAnchor(version, witness_program)";
  local_260 = "";
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_a70 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_208 = (allocator_type *)&local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)local_220,1,0,WARN,(check_type)paVar15,(size_t)&local_a78,
             0x90);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  CScript::clear(&s);
  pCVar7 = CScript::operator<<(&s,OP_9);
  pCVar7 = CScript::operator<<(pCVar7,OP_ADD);
  pCVar7 = CScript::operator<<(pCVar7,OP_11);
  CScript::operator<<(pCVar7,OP_EQUAL);
  local_a88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_a80 = "";
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_41.m_end = pvVar10;
  msg_41.m_begin = pvVar9;
  file_41.m_end = (iterator)0x95;
  file_41.m_begin = (iterator)&local_a88;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_a98,
             msg_41);
  local_218 = false;
  local_220 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = (allocator_type *)0xc694e1;
  local_aa8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_aa0 = "";
  TVar5 = Solver(&s,&solutions);
  local_258._0_4_ = TVar5;
  local_268 = (char *)((ulong)local_268 & 0xffffffff00000000);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
            (local_220,&local_aa8,0x95,1,2,&local_258,"Solver(s, solutions)",&local_268,
             "TxoutType::NONSTANDARD");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&witness_program.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&anchor_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&redeemScript.super_CScriptBase);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&solutions);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&s.super_CScriptBase);
  lVar6 = 0x28;
  do {
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   *)(&keys[0].fCompressed + lVar6));
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_Solver_success)
{
    CKey keys[3];
    CPubKey pubkeys[3];
    for (int i = 0; i < 3; i++) {
        keys[i].MakeNewKey(true);
        pubkeys[i] = keys[i].GetPubKey();
    }

    CScript s;
    std::vector<std::vector<unsigned char> > solutions;

    // TxoutType::PUBKEY
    s.clear();
    s << ToByteVector(pubkeys[0]) << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::PUBKEY);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0]));

    // TxoutType::PUBKEYHASH
    s.clear();
    s << OP_DUP << OP_HASH160 << ToByteVector(pubkeys[0].GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::PUBKEYHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0].GetID()));

    // TxoutType::SCRIPTHASH
    CScript redeemScript(s); // initialize with leftover P2PKH script
    s.clear();
    s << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::SCRIPTHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(CScriptID(redeemScript)));

    // TxoutType::MULTISIG
    s.clear();
    s << OP_1 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        OP_2 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::MULTISIG);
    BOOST_CHECK_EQUAL(solutions.size(), 4U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>({1}));
    BOOST_CHECK(solutions[1] == ToByteVector(pubkeys[0]));
    BOOST_CHECK(solutions[2] == ToByteVector(pubkeys[1]));
    BOOST_CHECK(solutions[3] == std::vector<unsigned char>({2}));

    s.clear();
    s << OP_2 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        ToByteVector(pubkeys[2]) <<
        OP_3 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::MULTISIG);
    BOOST_CHECK_EQUAL(solutions.size(), 5U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>({2}));
    BOOST_CHECK(solutions[1] == ToByteVector(pubkeys[0]));
    BOOST_CHECK(solutions[2] == ToByteVector(pubkeys[1]));
    BOOST_CHECK(solutions[3] == ToByteVector(pubkeys[2]));
    BOOST_CHECK(solutions[4] == std::vector<unsigned char>({3}));

    // TxoutType::NULL_DATA
    s.clear();
    s << OP_RETURN <<
        std::vector<unsigned char>({0}) <<
        std::vector<unsigned char>({75}) <<
        std::vector<unsigned char>({255});
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::NULL_DATA);
    BOOST_CHECK_EQUAL(solutions.size(), 0U);

    // TxoutType::WITNESS_V0_KEYHASH
    s.clear();
    s << OP_0 << ToByteVector(pubkeys[0].GetID());
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V0_KEYHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0].GetID()));

    // TxoutType::WITNESS_V0_SCRIPTHASH
    uint256 scriptHash;
    CSHA256().Write(redeemScript.data(), redeemScript.size())
        .Finalize(scriptHash.begin());

    s.clear();
    s << OP_0 << ToByteVector(scriptHash);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V0_SCRIPTHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(scriptHash));

    // TxoutType::WITNESS_V1_TAPROOT
    s.clear();
    s << OP_1 << ToByteVector(uint256::ZERO);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V1_TAPROOT);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(uint256::ZERO));

    // TxoutType::WITNESS_UNKNOWN
    s.clear();
    s << OP_16 << ToByteVector(uint256::ONE);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_UNKNOWN);
    BOOST_CHECK_EQUAL(solutions.size(), 2U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>{16});
    BOOST_CHECK(solutions[1] == ToByteVector(uint256::ONE));

    // TxoutType::ANCHOR
    std::vector<unsigned char> anchor_bytes{0x4e, 0x73};
    s.clear();
    s << OP_1 << anchor_bytes;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::ANCHOR);
    BOOST_CHECK(solutions.empty());

    // Sanity-check IsPayToAnchor
    int version{-1};
    std::vector<unsigned char> witness_program;
    BOOST_CHECK(s.IsPayToAnchor());
    BOOST_CHECK(s.IsWitnessProgram(version, witness_program));
    BOOST_CHECK(CScript::IsPayToAnchor(version, witness_program));

    // TxoutType::NONSTANDARD
    s.clear();
    s << OP_9 << OP_ADD << OP_11 << OP_EQUAL;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::NONSTANDARD);
}